

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_wstring_append_from_mbs(archive_wstring *dest,char *p,size_t len)

{
  char cVar1;
  archive_wstring *paVar2;
  int *piVar3;
  ulong in_RDX;
  char *in_RSI;
  long *in_RDI;
  mbstate_t shift_state;
  wchar_t *wcs;
  char *mbs;
  size_t mbs_length;
  size_t wcs_length;
  wchar_t ret_val;
  size_t r;
  size_t in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  mbstate_t local_58;
  wchar_t *local_50;
  char *local_48;
  ulong local_40;
  ulong local_38;
  wchar_t local_2c;
  size_t local_28;
  long *local_10;
  wchar_t local_4;
  
  local_2c = L'\0';
  local_48 = in_RSI;
  local_40 = in_RDX;
  local_38 = in_RDX;
  local_10 = in_RDI;
  memset(&local_58,0,8);
  paVar2 = archive_wstring_ensure
                     ((archive_wstring *)
                      CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  if (paVar2 == (archive_wstring *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_50 = (wchar_t *)(*local_10 + local_10[1] * 4);
    while (cVar1 = *local_48, cVar1 != '\0' && local_40 != 0) {
      if (local_38 == 0) {
        local_10[1] = (long)local_50 - *local_10 >> 2;
        *(undefined4 *)(*local_10 + local_10[1] * 4) = 0;
        local_38 = local_40;
        paVar2 = archive_wstring_ensure
                           ((archive_wstring *)
                            CONCAT17(cVar1 != '\0' && local_40 != 0,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
        if (paVar2 == (archive_wstring *)0x0) {
          return L'\xffffffff';
        }
        local_50 = (wchar_t *)(*local_10 + local_10[1] * 4);
      }
      local_28 = mbrtowc(local_50,local_48,local_38,&local_58);
      if ((local_28 == 0xffffffffffffffff) || (local_28 == 0xfffffffffffffffe)) {
        local_2c = L'\xffffffff';
        piVar3 = __errno_location();
        if (*piVar3 != 0x54) break;
        local_48 = local_48 + 1;
        local_40 = local_40 - 1;
      }
      else {
        if ((local_28 == 0) || (local_40 < local_28)) break;
        local_50 = local_50 + 1;
        local_38 = local_38 - 1;
        local_48 = local_48 + local_28;
        local_40 = local_40 - local_28;
      }
    }
    local_10[1] = (long)local_50 - *local_10 >> 2;
    *(undefined4 *)(*local_10 + local_10[1] * 4) = 0;
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int
archive_wstring_append_from_mbs(struct archive_wstring *dest,
    const char *p, size_t len)
{
	size_t r;
	int ret_val = 0;
	/*
	 * No single byte will be more than one wide character,
	 * so this length estimate will always be big enough.
	 */
	size_t wcs_length = len;
	size_t mbs_length = len;
	const char *mbs = p;
	wchar_t *wcs;
#if HAVE_MBRTOWC
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#endif
	if (NULL == archive_wstring_ensure(dest, dest->length + wcs_length + 1))
		return (-1);
	wcs = dest->s + dest->length;
	/*
	 * We cannot use mbsrtowcs/mbstowcs here because those may convert
	 * extra MBS when strlen(p) > len and one wide character consis of
	 * multi bytes.
	 */
	while (*mbs && mbs_length > 0) {
		if (wcs_length == 0) {
			dest->length = wcs - dest->s;
			dest->s[dest->length] = L'\0';
			wcs_length = mbs_length;
			if (NULL == archive_wstring_ensure(dest,
			    dest->length + wcs_length + 1))
				return (-1);
			wcs = dest->s + dest->length;
		}
#if HAVE_MBRTOWC
		r = mbrtowc(wcs, mbs, wcs_length, &shift_state);
#else
		r = mbtowc(wcs, mbs, wcs_length);
#endif
		if (r == (size_t)-1 || r == (size_t)-2) {
			ret_val = -1;
			if (errno == EILSEQ) {
				++mbs;
				--mbs_length;
				continue;
			} else
				break;
		}
		if (r == 0 || r > mbs_length)
			break;
		wcs++;
		wcs_length--;
		mbs += r;
		mbs_length -= r;
	}
	dest->length = wcs - dest->s;
	dest->s[dest->length] = L'\0';
	return (ret_val);
}